

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_init_search_range(int size)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = 0x10;
  if (0x10 < size) {
    iVar1 = size;
  }
  uVar3 = 0xffffffff;
  do {
    uVar3 = uVar3 + 1;
  } while (iVar1 << ((byte)uVar3 & 0x1f) < 0x3ff);
  uVar2 = 9;
  if (uVar3 < 9) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

int av1_init_search_range(int size) {
  int sr = 0;
  // Minimum search size no matter what the passed in value.
  size = AOMMAX(16, size);

  while ((size << sr) < MAX_FULL_PEL_VAL) sr++;

  sr = AOMMIN(sr, MAX_MVSEARCH_STEPS - 2);
  return sr;
}